

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O3

void __thiscall EfcFlash::writeOptions(EfcFlash *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  _Bit_type *p_Var5;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  void *local_58 [4];
  long local_38;
  
  iVar3 = (*(this->super_Flash)._vptr_Flash[0x16])();
  if ((((char)iVar3 != '\0') && ((this->super_Flash)._bootFlash._dirty == true)) &&
     (bVar1 = (this->super_Flash)._bootFlash._value,
     iVar3 = (*(this->super_Flash)._vptr_Flash[0x14])(this), bVar1 != (bool)(char)iVar3)) {
    waitFSR(this,1);
    Samba::writeWord((this->super_Flash)._samba,0xffffff64,
                     ((this->super_Flash)._bootFlash._value ^ 1) * 2 + 0x5a00020b);
  }
  iVar3 = (*(this->super_Flash)._vptr_Flash[0x13])(this);
  if ((((char)iVar3 != '\0') && ((this->super_Flash)._bor._dirty == true)) &&
     (bVar1 = (this->super_Flash)._bor._value,
     iVar3 = (*(this->super_Flash)._vptr_Flash[0x11])(this), bVar1 != (bool)(char)iVar3)) {
    waitFSR(this,1);
    Samba::writeWord((this->super_Flash)._samba,0xffffff64,
                     ((this->super_Flash)._bor._value ^ 1) * 2 + 0x5a00010b);
  }
  iVar3 = (*(this->super_Flash)._vptr_Flash[0x10])(this);
  if ((((char)iVar3 != '\0') && ((this->super_Flash)._bod._dirty == true)) &&
     (bVar1 = (this->super_Flash)._bod._value, iVar3 = (*(this->super_Flash)._vptr_Flash[0xe])(this)
     , bVar1 != (bool)(char)iVar3)) {
    waitFSR(this,1);
    Samba::writeWord((this->super_Flash)._samba,0xffffff64,
                     ((this->super_Flash)._bod._value ^ 1) * 2 + 0x5a00000b);
  }
  if ((this->super_Flash)._regions._dirty == true) {
    (*(this->super_Flash)._vptr_Flash[10])(local_58,this);
    p_Var5 = (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if (((long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
               _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)p_Var5) * 8 +
        (ulong)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
               _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
      if (local_58[0] == (void *)0x0) goto LAB_0010f061;
    }
    else {
      uVar9 = 0;
      do {
        uVar8 = (uint)uVar9;
        uVar6 = (ulong)(uint)((int)(uVar9 >> 6) * 8);
        if (((*(ulong *)((long)p_Var5 + uVar6) >> (uVar8 & 0x3f) & 1) != 0) !=
            ((*(ulong *)((long)local_58[0] + uVar6) >> (uVar8 & 0x3f) & 1) != 0)) {
          uVar2 = (this->super_Flash)._lockRegions;
          if (((this->super_Flash)._planes == 2) && (uVar4 = uVar2 >> 1, uVar4 <= uVar8)) {
            uVar7 = (this->super_Flash)._pages;
            waitFSR(this,1);
            uVar4 = uVar7 * (uVar8 - uVar4);
            uVar7 = 0xffffff74;
          }
          else {
            uVar7 = (this->super_Flash)._pages;
            waitFSR(this,1);
            uVar4 = uVar7 * uVar8;
            uVar7 = 0xffffff64;
          }
          Samba::writeWord((this->super_Flash)._samba,uVar7,
                           (uVar4 / uVar2) * 0x100 +
                           (uint)(((this->super_Flash)._regions._value.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                   [uVar9 >> 6] & 1L << ((byte)uVar9 & 0x3f)) == 0) * 2 + 2 |
                           0x5a000000);
        }
        uVar9 = (ulong)(uVar8 + 1);
        p_Var5 = (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      } while (uVar9 < (ulong)(this->super_Flash)._regions._value.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)(this->super_Flash)._regions._value.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)p_Var5) * 8);
    }
    operator_delete(local_58[0],local_38 - (long)local_58[0]);
  }
LAB_0010f061:
  if ((((this->super_Flash)._security._dirty == true) &&
      ((this->super_Flash)._security._value == true)) &&
     (iVar3 = (*(this->super_Flash)._vptr_Flash[0xc])(this), (char)iVar3 != '\x01')) {
    waitFSR(this,1);
    Samba::writeWord((this->super_Flash)._samba,0xffffff64,0x5a00000f);
  }
  return;
}

Assistant:

void
EfcFlash::writeOptions()
{
    if (canBootFlash() && _bootFlash.isDirty() && _bootFlash.get() != getBootFlash())
    {
        waitFSR();
        writeFCR0(_bootFlash.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 2);
    }
    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        waitFSR();
        writeFCR0(_bor.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 1);
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        waitFSR();
        writeFCR0(_bod.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 0);
    }
    if (_regions.isDirty())
    {
        uint32_t page;
        std::vector<bool> current;

        current = getLockRegions();

        for (uint32_t region = 0; region < _regions.get().size(); region++)
        {
            if (_regions.get()[region] != current[region])
            {
                if (_planes == 2 && region >= _lockRegions / 2)
                {
                    page = (region - _lockRegions / 2) * _pages / _lockRegions;
                    waitFSR();
                    writeFCR1(_regions.get()[region] ? EFC_FCMD_SLB : EFC_FCMD_CLB, page);
                }
                else
                {
                    page = region * _pages / _lockRegions;
                    waitFSR();
                    writeFCR0(_regions.get()[region] ? EFC_FCMD_SLB : EFC_FCMD_CLB, page);
                }
            }
        }
    }
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        waitFSR();
        writeFCR0(EFC_FCMD_SSB, 0);
    }
}